

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  UnitTest *this;
  int local_4;
  
  testing::InitGoogleTest(&local_4,argv);
  this = testing::UnitTest::GetInstance();
  iVar1 = testing::UnitTest::Run(this);
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
    //MPI_Init(&argc, &argv);

    #ifdef WITH_CUDA
    // if testing with CUDA turned on, first check that we can initialize CUDA
    if(!initialize_cuda()) {
        std::cerr << "ERROR: unable to initialize CUDA" << std::endl;
        return 1;
    }
    #endif

    ::testing::InitGoogleTest(&argc, argv);
    return RUN_ALL_TESTS();
    //MPI_Finalize();
}